

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall PeleLM::post_regrid(PeleLM *this,int lbase,int new_finest)

{
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> this_00;
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  int iVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  double dVar11;
  MFIter mfi;
  Box local_17c;
  long local_160;
  PeleLM *local_158;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  double *local_120;
  ulong local_118;
  Array4<double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  NavierStokesBase::post_regrid(&this->super_NavierStokesBase,lbase,new_finest);
  if (do_set_rho_to_species_sum != 0) {
    if ((0 < *(((this->super_NavierStokesBase).super_AmrLevel.parent)->level_steps).
              super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start) &&
       (lbase < (this->super_NavierStokesBase).super_AmrLevel.level)) {
      local_150._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (((this->super_NavierStokesBase).super_AmrLevel.state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start)->new_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
      local_158 = this;
      amrex::MFIter::MFIter
                (&local_90,
                 (FabArrayBase *)
                 local_150._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,true);
      if (local_90.currentIndex < local_90.endIndex) {
        do {
          amrex::MFIter::tilebox(&local_17c,&local_90);
          this_00._M_t.
          super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
          super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
               (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)
               (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)local_150;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_d0,
                     (FabArray<amrex::FArrayBox> *)
                     local_150._M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_90,3);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_110,
                     (FabArray<amrex::FArrayBox> *)
                     this_00._M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_90,
                     first_spec);
          if ((clipSpeciesOnRegrid != 0) && (local_17c.smallend.vect[2] <= local_17c.bigend.vect[2])
             ) {
            iVar4 = local_17c.smallend.vect[2];
            do {
              if (local_17c.smallend.vect[1] <= local_17c.bigend.vect[1]) {
                pdVar1 = (double *)
                         ((long)local_110.p +
                         ((long)iVar4 - (long)local_110.begin.z) * local_110.kstride * 8 +
                         ((long)local_17c.smallend.vect[1] - (long)local_110.begin.y) *
                         local_110.jstride * 8 + (long)local_17c.smallend.vect[0] * 8 +
                         (long)local_110.begin.x * -8);
                lVar7 = (long)local_17c.smallend.vect[1];
                do {
                  lVar5 = (long)local_17c.smallend.vect[0];
                  pdVar3 = pdVar1;
                  if (local_17c.smallend.vect[0] <= local_17c.bigend.vect[0]) {
                    do {
                      lVar9 = 0x15;
                      pdVar6 = pdVar3;
                      do {
                        dVar11 = *pdVar6;
                        if (1.79769313486232e+308 <= dVar11) {
                          dVar11 = 1.79769313486232e+308;
                        }
                        if (dVar11 <= 0.0) {
                          dVar11 = 0.0;
                        }
                        *pdVar6 = dVar11;
                        pdVar6 = pdVar6 + local_110.nstride;
                        lVar9 = lVar9 + -1;
                      } while (lVar9 != 0);
                      lVar5 = lVar5 + 1;
                      pdVar3 = pdVar3 + 1;
                    } while (local_17c.bigend.vect[0] + 1 != (int)lVar5);
                  }
                  lVar7 = lVar7 + 1;
                  pdVar1 = pdVar1 + local_110.jstride;
                } while (local_17c.bigend.vect[1] + 1U != (int)lVar7);
              }
              bVar10 = iVar4 != local_17c.bigend.vect[2];
              iVar4 = iVar4 + 1;
            } while (bVar10);
          }
          if (local_17c.smallend.vect[2] <= local_17c.bigend.vect[2]) {
            local_120 = local_d0.p;
            local_128 = local_d0.kstride;
            local_130 = (long)local_d0.begin.z;
            local_160 = (long)local_17c.smallend.vect[1];
            local_118 = (ulong)(uint)local_17c.bigend.vect[1];
            local_148 = (local_160 - local_110.begin.y) * local_110.jstride * 8 +
                        (long)local_17c.smallend.vect[0] * 8 + (long)local_110.begin.x * -8 +
                        (long)local_110.p;
            local_138 = local_110.kstride * 8;
            local_140 = -(long)local_110.begin.z;
            iVar4 = local_17c.smallend.vect[2];
            do {
              if (local_17c.smallend.vect[1] <= local_17c.bigend.vect[1]) {
                pdVar1 = (double *)((local_140 + iVar4) * local_138 + local_148);
                lVar5 = (iVar4 - local_130) * local_d0.kstride;
                lVar7 = local_160;
                do {
                  if (local_17c.smallend.vect[0] <= local_17c.bigend.vect[0]) {
                    lVar2 = (lVar7 - local_d0.begin.y) * local_d0.jstride;
                    pdVar3 = pdVar1;
                    lVar9 = (long)local_17c.smallend.vect[0];
                    do {
                      local_d0.p[lVar5 + lVar2 + (lVar9 - local_d0.begin.x)] = 0.0;
                      dVar11 = 0.0;
                      lVar8 = 0x15;
                      pdVar6 = pdVar3;
                      do {
                        dVar11 = dVar11 + *pdVar6;
                        local_d0.p[lVar5 + lVar2 + (lVar9 - local_d0.begin.x)] = dVar11;
                        pdVar6 = pdVar6 + local_110.nstride;
                        lVar8 = lVar8 + -1;
                      } while (lVar8 != 0);
                      lVar9 = lVar9 + 1;
                      pdVar3 = pdVar3 + 1;
                    } while (local_17c.bigend.vect[0] + 1 != (int)lVar9);
                  }
                  lVar7 = lVar7 + 1;
                  pdVar1 = pdVar1 + local_110.jstride;
                } while (local_17c.bigend.vect[1] + 1U != (int)lVar7);
              }
              bVar10 = iVar4 != local_17c.bigend.vect[2];
              iVar4 = iVar4 + 1;
            } while (bVar10);
          }
          amrex::MFIter::operator++(&local_90);
        } while (local_90.currentIndex < local_90.endIndex);
      }
      amrex::MFIter::~MFIter(&local_90);
      this = local_158;
    }
    NavierStokesBase::make_rho_curr_time(&this->super_NavierStokesBase);
  }
  return;
}

Assistant:

void
PeleLM::post_regrid (int lbase,
                     int new_finest)
{
   BL_PROFILE("PLM::post_regrid()");
   NavierStokesBase::post_regrid(lbase, new_finest);
   //
   // FIXME: This may be necessary regardless, unless the interpolation
   //        to fine from coarse data preserves rho=sum(rho.Y)
   //
   if (!do_set_rho_to_species_sum) return;

   if (parent->levelSteps(0)>0 && level>lbase) {
      MultiFab& Snew = get_new_data(State_Type);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
      for (MFIter mfi(Snew,TilingIfNotGPU()); mfi.isValid(); ++mfi)
      {
         const Box& bx = mfi.tilebox();
         auto const& rho     = Snew.array(mfi,Density);
         auto const& rhoY    = Snew.array(mfi,first_spec);
         if (clipSpeciesOnRegrid) {
            amrex::ParallelFor(bx, [rhoY]
            AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
               fabMinMax( i, j, k, NUM_SPECIES, 0.0, Real_MAX, rhoY);
            });
         }
         amrex::ParallelFor(bx, [rho, rhoY]
         AMREX_GPU_DEVICE (int i, int j, int k) noexcept
         {
            rho(i,j,k) = 0.0;
            for (int n = 0; n < NUM_SPECIES; n++) {
               rho(i,j,k) += rhoY(i,j,k,n);
            }
         });
      }
   }
   make_rho_curr_time();
}